

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.hpp
# Opt level: O0

size_t poplar::get_process_size(void)

{
  long lVar1;
  int iVar2;
  size_t vm;
  size_t dummy;
  FILE *fp;
  long local_18 [2];
  FILE *local_8;
  
  local_8 = fopen("/proc/self/statm","r");
  local_18[1] = 0;
  local_18[0] = 0;
  __isoc99_fscanf(local_8,"%ld %ld ",local_18 + 1,local_18);
  fclose(local_8);
  lVar1 = local_18[0];
  iVar2 = getpagesize();
  return lVar1 * iVar2;
}

Assistant:

inline size_t get_process_size() {
#ifdef __APPLE__
    struct task_basic_info t_info;
    mach_msg_type_number_t t_info_count = TASK_BASIC_INFO_COUNT;
    task_info(current_task(), TASK_BASIC_INFO, reinterpret_cast<task_info_t>(&t_info), &t_info_count);
    return t_info.resident_size;
#else
    FILE* fp = std::fopen("/proc/self/statm", "r");
    size_t dummy(0), vm(0);
    std::fscanf(fp, "%ld %ld ", &dummy, &vm);  // get resident (see procfs)
    std::fclose(fp);
    return vm * ::getpagesize();
#endif
}